

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

IPGMContext * __thiscall
r_exec::IPGMContext::operator*(IPGMContext *__return_storage_ptr__,IPGMContext *this)

{
  Overlay **ppOVar1;
  PGMOverlay *pPVar2;
  Overlay *pOVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  uint16_t uVar7;
  ushort uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Code *pCVar10;
  View *pVVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  _func_int **pp_Var12;
  undefined4 extraout_var_05;
  Atom *pAVar13;
  undefined4 extraout_var_06;
  undefined8 uVar14;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ushort unaff_BP;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  IPGMContext s;
  Atom a;
  uint16_t unused_index;
  IPGMContext local_d8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  IPGMContext local_90;
  IPGMContext local_60;
  
  cVar4 = r_code::Atom::getDescriptor();
  switch(cVar4) {
  case -0x7c:
    local_a8 = this->object;
    uStack_a0 = this->view;
    pAVar13 = (this->super__Context).code;
    local_d8.super__Context.index = r_code::Atom::asIndex();
    local_d8.super__Context.overlay = (this->super__Context).overlay;
    local_d8.super__Context.data = (this->super__Context).data;
    local_d8.object = local_a8;
    local_d8.view = uStack_a0;
    local_d8.super__Context.code = pAVar13;
    break;
  case -0x7b:
    pCVar10 = this->object;
    uVar8 = r_code::Atom::asIndex();
    iVar9 = (*(pCVar10->super__Object)._vptr__Object[9])(pCVar10,(ulong)uVar8);
    pCVar10 = (Code *)CONCAT44(extraout_var_04,iVar9);
    pp_Var12 = (pCVar10->super__Object)._vptr__Object;
    goto LAB_0015cc30;
  case -0x7a:
    pAVar13 = (this->super__Context).code;
    uVar8 = r_code::Atom::asIndex();
    local_90.super__Context._vptr__Context =
         (_func_int **)
         CONCAT44(local_90.super__Context._vptr__Context._4_4_,
                  *(undefined4 *)(pAVar13 + (ulong)uVar8 * 4));
    cVar4 = r_code::Atom::getDescriptor();
    if (cVar4 == -0x7c) {
      pAVar13 = (this->super__Context).code;
      unaff_BP = r_code::Atom::asIndex();
      r_code::Atom::operator=((Atom *)&local_90,pAVar13 + (ulong)unaff_BP * 4);
    }
    cVar4 = r_code::Atom::isStructural();
    if (cVar4 == '\0') {
      pAVar13 = (this->super__Context).code;
      pCVar10 = this->object;
      pVVar11 = this->view;
      local_d8.super__Context.index = r_code::Atom::asIndex();
      local_d8.super__Context.overlay = (this->super__Context).overlay;
      local_d8.super__Context.data = (this->super__Context).data;
      local_d8.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
      local_d8.super__Context.code = pAVar13;
      local_d8.object = pCVar10;
      local_d8.view = pVVar11;
      operator*(__return_storage_ptr__,&local_d8);
    }
    else {
      local_d8.object = this->object;
      local_d8.view = this->view;
      local_d8.super__Context.overlay = (this->super__Context).overlay;
      local_d8.super__Context.code = (this->super__Context).code;
      local_d8.super__Context.data = (this->super__Context).data;
      local_d8.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
      local_d8.super__Context.index = unaff_BP;
      bVar5 = evaluate_no_dereference(&local_d8,(uint16_t *)&local_60);
      (__return_storage_ptr__->super__Context)._vptr__Context =
           (_func_int **)&PTR___Context_001be470;
      ppOVar1 = &(__return_storage_ptr__->super__Context).overlay;
      if (bVar5) {
        (__return_storage_ptr__->super__Context).index = local_d8.super__Context.index;
        *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a =
             local_d8.super__Context._26_2_;
        (__return_storage_ptr__->super__Context).data = local_d8.super__Context.data;
        *ppOVar1 = local_d8.super__Context.overlay;
        (__return_storage_ptr__->super__Context).code = local_d8.super__Context.code;
        (__return_storage_ptr__->super__Context)._vptr__Context =
             (_func_int **)&PTR___Context_001be3f0;
        uVar15 = local_d8.object._0_4_;
        uVar16 = local_d8.object._4_4_;
        uVar17 = local_d8.view._0_4_;
        uVar18 = local_d8.view._4_4_;
      }
      else {
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        uVar18 = 0;
        *ppOVar1 = (Overlay *)0x0;
        (__return_storage_ptr__->super__Context).code = (Atom *)0x0;
        (__return_storage_ptr__->super__Context).index = 0;
        (__return_storage_ptr__->super__Context).data = UNDEFINED;
        (__return_storage_ptr__->super__Context)._vptr__Context =
             (_func_int **)&PTR___Context_001be3f0;
      }
      *(undefined4 *)&__return_storage_ptr__->object = uVar15;
      *(undefined4 *)((long)&__return_storage_ptr__->object + 4) = uVar16;
      *(undefined4 *)&__return_storage_ptr__->view = uVar17;
      *(undefined4 *)((long)&__return_storage_ptr__->view + 4) = uVar18;
    }
    r_code::Atom::~Atom((Atom *)&local_90);
    return __return_storage_ptr__;
  case -0x79:
    pCVar10 = (Code *)(((this->super__Context).overlay)->controller->view->object).object;
    uVar7 = r_code::Atom::asIndex();
    iVar9 = (*(pCVar10->super__Object)._vptr__Object[4])(pCVar10,0);
    local_d8.super__Context.overlay = (Overlay *)0x0;
    local_d8.super__Context.data = REFERENCE;
    local_d8.view = (View *)0x0;
    local_d8.super__Context.code = (Atom *)CONCAT44(extraout_var_02,iVar9);
    local_d8.super__Context.index = uVar7;
    local_d8.object = pCVar10;
    break;
  case -0x78:
    pPVar2 = (PGMOverlay *)(this->super__Context).overlay;
    bVar6 = r_code::Atom::asInputIndex();
    pCVar10 = PGMOverlay::getInputObject(pPVar2,(ushort)bVar6);
    pPVar2 = (PGMOverlay *)(this->super__Context).overlay;
    bVar6 = r_code::Atom::asInputIndex();
    pVVar11 = (View *)PGMOverlay::getInputView(pPVar2,(ushort)bVar6);
    iVar9 = (*(pCVar10->super__Object)._vptr__Object[4])(pCVar10,0);
    local_d8.super__Context.index = r_code::Atom::asIndex();
    local_d8.super__Context.overlay = (Overlay *)0x0;
    local_d8.super__Context.data = REFERENCE;
    local_d8.super__Context.code = (Atom *)CONCAT44(extraout_var_01,iVar9);
    local_d8.object = pCVar10;
    local_d8.view = pVVar11;
    break;
  case -0x77:
    local_a8 = this->object;
    uStack_a0 = this->view;
    pAVar13 = r_code::vector<r_code::Atom>::operator[](&((this->super__Context).overlay)->values,0);
    uVar7 = r_code::Atom::asIndex();
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = pAVar13;
    (__return_storage_ptr__->super__Context).index = uVar7;
    (__return_storage_ptr__->super__Context).data = VALUE_ARRAY;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    local_d8.object._0_4_ = (undefined4)local_a8;
    local_d8.object._4_4_ = local_a8._4_4_;
    local_d8.view._0_4_ = (undefined4)uStack_a0;
    local_d8.view._4_4_ = uStack_a0._4_4_;
    goto LAB_0015cdca;
  case -0x76:
    pOVar3 = (this->super__Context).overlay;
    uVar8 = r_code::Atom::asIndex();
    pCVar10 = (Code *)pOVar3[1].super__Object._vptr__Object[uVar8];
    pp_Var12 = (pCVar10->super__Object)._vptr__Object;
LAB_0015cc30:
    iVar9 = (*pp_Var12[4])(pCVar10,0);
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_05,iVar9);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = REFERENCE;
LAB_0015cc50:
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    __return_storage_ptr__->object = pCVar10;
    __return_storage_ptr__->view = (View *)0x0;
    return __return_storage_ptr__;
  case -0x75:
  case -0x73:
  case -0x72:
  case -0x71:
    goto switchD_0015c7f3_caseD_8b;
  case -0x74:
    local_a8 = this->object;
    uStack_a0 = this->view;
    pAVar13 = (this->super__Context).code;
    bVar6 = r_code::Atom::asRelativeIndex();
    local_90.super__Context.overlay = (this->super__Context).overlay;
    local_90.super__Context.data = (this->super__Context).data;
    local_90.super__Context.index = (uint16_t)bVar6;
    local_90.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    local_90.object = local_a8;
    local_90.view = uStack_a0;
    local_90.super__Context.code = pAVar13;
    operator*(&local_d8,&local_90);
    iVar9 = (*((local_d8.object)->super__Object)._vptr__Object[4])(local_d8.object,0);
    local_90.super__Context.index = r_code::Atom::asIndex();
    local_90.super__Context.overlay = (Overlay *)0x0;
    local_90.super__Context.data = REFERENCE;
    local_90.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    local_90.object = local_d8.object;
    local_90.view = (View *)0x0;
    local_90.super__Context.code = (Atom *)CONCAT44(extraout_var_06,iVar9);
    operator*(__return_storage_ptr__,&local_90);
    return __return_storage_ptr__;
  case -0x70:
    pVVar11 = (View *)((this->super__Context).overlay)->controller->view;
    pCVar10 = (Code *)(pVVar11->super_View).object.object;
    iVar9 = (*(pCVar10->super__Object)._vptr__Object[4])(pCVar10,0);
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_00,iVar9);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = REFERENCE;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    __return_storage_ptr__->object = pCVar10;
    __return_storage_ptr__->view = pVVar11;
    return __return_storage_ptr__;
  case -0x6f:
    pOVar3 = (this->super__Context).overlay;
    if ((pOVar3 != (Overlay *)0x0) &&
       (pCVar10 = this->object, pCVar10 == (Code *)(pOVar3->controller->view->object).object)) {
      pVVar11 = this->view;
      (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
      (__return_storage_ptr__->super__Context).code = (Atom *)&(pVVar11->super_View).field_0x28;
      (__return_storage_ptr__->super__Context).index = 0;
      (__return_storage_ptr__->super__Context).data = VIEW;
      (__return_storage_ptr__->super__Context)._vptr__Context =
           (_func_int **)&PTR___Context_001be3f0;
      __return_storage_ptr__->object = pCVar10;
LAB_0015cf26:
      __return_storage_ptr__->view = pVVar11;
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be470;
    pAVar13 = (this->super__Context).code;
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = pAVar13;
    uVar14._0_2_ = (this->super__Context).index;
    uVar14._2_2_ = *(undefined2 *)&(this->super__Context).field_0x1a;
    uVar14._4_4_ = (this->super__Context).data;
    goto LAB_0015cdb3;
  case -0x6e:
    pCVar10 = this->object;
    iVar9 = (*(pCVar10->super__Object)._vptr__Object[4])(pCVar10,0);
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_03,iVar9);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = MKS;
    goto LAB_0015cc50;
  case -0x6d:
    pCVar10 = this->object;
    iVar9 = (*(pCVar10->super__Object)._vptr__Object[4])(pCVar10,0);
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var,iVar9);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = VWS;
    goto LAB_0015cc50;
  default:
    if (cVar4 == -0x40) {
      getChild(&local_90,this,1);
      operator*(&local_d8,&local_90);
      for (uVar8 = 2; iVar9 = (*(this->super__Context)._vptr__Context[6])(this),
          uVar8 <= (ushort)iVar9; uVar8 = uVar8 + 1) {
        cVar4 = r_code::Atom::getDescriptor();
        pCVar10 = local_d8.object;
        if (cVar4 != -0x6f) {
          if (cVar4 == -0x6e) {
            iVar9 = (*((local_d8.object)->super__Object)._vptr__Object[4])(local_d8.object,0);
            (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
            (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_07,iVar9);
            (__return_storage_ptr__->super__Context).index = 0;
            (__return_storage_ptr__->super__Context).data = MKS;
          }
          else {
            if (cVar4 != -0x6d) {
              uVar7 = r_code::Atom::asIndex();
              getChild(&local_60,&local_d8,uVar7);
              operator*(&local_90,&local_60);
              local_d8.object = local_90.object;
              local_d8.view = local_90.view;
              local_d8.super__Context.code = local_90.super__Context.code;
              local_d8.super__Context.index = local_90.super__Context.index;
              local_d8.super__Context.data = local_90.super__Context.data;
              goto LAB_0015c947;
            }
            iVar9 = (*((local_d8.object)->super__Object)._vptr__Object[4])(local_d8.object,0);
            (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
            (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_08,iVar9);
            (__return_storage_ptr__->super__Context).index = 0;
            (__return_storage_ptr__->super__Context).data = VWS;
          }
          pVVar11 = (View *)0x0;
          (__return_storage_ptr__->super__Context)._vptr__Context =
               (_func_int **)&PTR___Context_001be3f0;
          __return_storage_ptr__->object = pCVar10;
          goto LAB_0015cf26;
        }
        if (local_d8.view == (View *)0x0) {
          local_d8.object._0_4_ = 0;
          local_d8.object._4_4_ = 0;
          local_d8.view._0_4_ = 0;
          local_d8.view._4_4_ = 0;
          (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
          (__return_storage_ptr__->super__Context).code = (Atom *)0x0;
          (__return_storage_ptr__->super__Context).index = 0;
          (__return_storage_ptr__->super__Context).data = UNDEFINED;
          (__return_storage_ptr__->super__Context)._vptr__Context =
               (_func_int **)&PTR___Context_001be3f0;
          goto LAB_0015cdca;
        }
        local_d8.super__Context.code = (Atom *)&((local_d8.view)->super_View).field_0x28;
        local_d8.super__Context.index = 0;
        local_d8.super__Context.data = VIEW;
LAB_0015c947:
      }
      (__return_storage_ptr__->super__Context)._vptr__Context =
           (_func_int **)&PTR___Context_001be470;
      (__return_storage_ptr__->super__Context).overlay = local_d8.super__Context.overlay;
      (__return_storage_ptr__->super__Context).code = local_d8.super__Context.code;
      (__return_storage_ptr__->super__Context).index = local_d8.super__Context.index;
      *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a =
           local_d8.super__Context._26_2_;
      (__return_storage_ptr__->super__Context).data = local_d8.super__Context.data;
      (__return_storage_ptr__->super__Context)._vptr__Context =
           (_func_int **)&PTR___Context_001be3f0;
      goto LAB_0015cdca;
    }
    goto switchD_0015c7f3_caseD_8b;
  }
  local_d8.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
  operator*(__return_storage_ptr__,&local_d8);
  return __return_storage_ptr__;
switchD_0015c7f3_caseD_8b:
  (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be470;
  pAVar13 = (this->super__Context).code;
  (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
  (__return_storage_ptr__->super__Context).code = pAVar13;
  uVar14._0_2_ = (this->super__Context).index;
  uVar14._2_2_ = *(undefined2 *)&(this->super__Context).field_0x1a;
  uVar14._4_4_ = (this->super__Context).data;
LAB_0015cdb3:
  (__return_storage_ptr__->super__Context).index = (short)uVar14;
  *(short *)&(__return_storage_ptr__->super__Context).field_0x1a = (short)((ulong)uVar14 >> 0x10);
  (__return_storage_ptr__->super__Context).data = (int)((ulong)uVar14 >> 0x20);
  (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
  local_d8.object._0_4_ = *(undefined4 *)&this->object;
  local_d8.object._4_4_ = *(undefined4 *)((long)&this->object + 4);
  local_d8.view._0_4_ = *(undefined4 *)&this->view;
  local_d8.view._4_4_ = *(undefined4 *)((long)&this->view + 4);
LAB_0015cdca:
  *(undefined4 *)&__return_storage_ptr__->object = local_d8.object._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->object + 4) = local_d8.object._4_4_;
  *(undefined4 *)&__return_storage_ptr__->view = local_d8.view._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->view + 4) = local_d8.view._4_4_;
  return __return_storage_ptr__;
}

Assistant:

IPGMContext IPGMContext::operator *() const
{
    switch ((*this)[0].getDescriptor()) {
    case Atom::VL_PTR: { // evaluate the code if necessary.
        // TODO: OPTIMIZATION: if not in a cptr and if this eventually points to an r-ptr or in-obj-ptr,
        // patch the code at this->index, i.e. replace the vl ptr by the in-obj-ptr or rptr.
        Atom a = code[(*this)[0].asIndex()];
        uint16_t structure_index;

        if (a.getDescriptor() == Atom::I_PTR) { // dereference once.
            a = code[structure_index = a.asIndex()];
        }

        if (a.isStructural()) { // the target location is not evaluated yet.
            IPGMContext s(object, view, code, structure_index, (InputLessPGMOverlay *)overlay, data);
            uint16_t unused_index;

            if (s.evaluate_no_dereference(unused_index)) {
                return s;    // patched code: atom at VL_PTR's index changed to VALUE_PTR or 32 bits result.
            } else { // evaluation failed, return undefined context.
                return IPGMContext();
            }
        } else {
            return *IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);
        }
    }

    case Atom::I_PTR:
        return *IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);

    case Atom::R_PTR: {
        Code *o = object->get_reference((*this)[0].asIndex());
        return IPGMContext(o, nullptr, &o->code(0), 0, nullptr, REFERENCE);
    }

    case Atom::C_PTR: {
        IPGMContext c = *getChild(1);

        for (uint16_t i = 2; i <= getChildrenCount(); ++i) {
            switch ((*this)[i].getDescriptor()) {
            case Atom::VIEW: // accessible only for this and input objects.
                if (c.view) {
                    c = IPGMContext(c.getObject(), c.view, &c.view->code(0), 0, nullptr, VIEW);
                } else {
                    return IPGMContext();
                }

                break;

            case Atom::MKS:
                return IPGMContext(c.getObject(), MKS);
                break;

            case Atom::VWS:
                return IPGMContext(c.getObject(), VWS);
                break;

            default:
                c = *c.getChild((*this)[i].asIndex());
            }
        }

        return c;
    }

    case Atom::THIS: // refers to the ipgm; the pgm view is not available.
        return IPGMContext(overlay->getObject(), overlay->getView(), &overlay->getObject()->code(0), 0, (InputLessPGMOverlay *)overlay, REFERENCE);

    case Atom::VIEW: // never a reference, always in a cptr.
        if (overlay && object == overlay->getObject()) {
            return IPGMContext(object, view, &view->code(0), 0, nullptr, VIEW);
        }

        return *this;

    case Atom::MKS:
        return IPGMContext(object, MKS);

    case Atom::VWS:
        return IPGMContext(object, VWS);

    case Atom::VALUE_PTR:
        return IPGMContext(object, view, &overlay->values[0], (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, VALUE_ARRAY);

    case Atom::IPGM_PTR:
        return *IPGMContext(overlay->getObject(), (*this)[0].asIndex());

    case Atom::IN_OBJ_PTR: {
        Code *input_object = ((PGMOverlay *)overlay)->getInputObject((*this)[0].asInputIndex());
        View *input_view = (r_exec::View*)((PGMOverlay *)overlay)->getInputView((*this)[0].asInputIndex());
        return *IPGMContext(input_object, input_view, &input_object->code(0), (*this)[0].asIndex(), nullptr, REFERENCE);
    }

    case Atom::D_IN_OBJ_PTR: {
        IPGMContext parent = *IPGMContext(object, view, code, (*this)[0].asRelativeIndex(), (InputLessPGMOverlay *)overlay, data);
        Code *parent_object = parent.object;
        return *IPGMContext(parent_object, nullptr, &parent_object->code(0), (*this)[0].asIndex(), nullptr, REFERENCE);
    }

    case Atom::PROD_PTR:
        return IPGMContext(((InputLessPGMOverlay *)overlay)->productions[(*this)[0].asIndex()], 0);

    default:
        return *this;
    }
}